

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

void ImportModuleNamespaces(ParseContext *ctx,Lexeme *pos,ByteCode *bCode)

{
  SmallArray<SynNamespaceElement_*,_32U> *this;
  int iVar1;
  int iVar2;
  char *pcVar3;
  ExternNamespaceInfo *pEVar4;
  SynNamespaceElement **ppSVar5;
  undefined4 extraout_var;
  Lexeme *begin;
  Lexeme *end;
  size_t sVar6;
  undefined4 extraout_var_00;
  char *__s;
  ulong uVar7;
  uint k;
  uint index;
  InplaceStr name;
  SynNamespaceElement *local_78;
  SynNamespaceElement *local_48;
  TraceScope traceScope;
  
  if ((ImportModuleNamespaces(ParseContext&,Lexeme*,ByteCode*)::token == '\0') &&
     (iVar1 = __cxa_guard_acquire(&ImportModuleNamespaces(ParseContext&,Lexeme*,ByteCode*)::token),
     iVar1 != 0)) {
    ImportModuleNamespaces::token = NULLC::TraceGetToken("parser","ImportModuleNamespaces");
    __cxa_guard_release(&ImportModuleNamespaces(ParseContext&,Lexeme*,ByteCode*)::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,ImportModuleNamespaces::token);
  pcVar3 = FindSymbols(bCode);
  pEVar4 = FindFirstNamespace(bCode);
  this = &ctx->namespaceList;
  uVar7 = 0;
  do {
    if (bCode->namespaceCount <= uVar7) {
      NULLC::TraceScope::~TraceScope(&traceScope);
      return;
    }
    __s = pcVar3 + pEVar4[uVar7].offsetToName;
    if (pEVar4[uVar7].parentHash == 0xffffffff) {
      local_78 = (SynNamespaceElement *)0x0;
    }
    else {
      index = 0;
      while( true ) {
        if ((ctx->namespaceList).count <= index) goto LAB_001169bb;
        ppSVar5 = SmallArray<SynNamespaceElement_*,_32U>::operator[](this,index);
        if ((*ppSVar5)->fullNameHash == pEVar4[uVar7].parentHash) break;
        index = index + 1;
      }
      ppSVar5 = SmallArray<SynNamespaceElement_*,_32U>::operator[](this,index);
      local_78 = *ppSVar5;
      if (local_78 == (SynNamespaceElement *)0x0) {
LAB_001169bb:
        anon_unknown.dwarf_1519a::Stop(ctx,pos,"ERROR: namespace %s parent not found",__s);
      }
    }
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    begin = ParseContext::Previous(ctx);
    end = ParseContext::Previous(ctx);
    sVar6 = strlen(__s);
    name.end = __s + sVar6;
    name.begin = __s;
    SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var,iVar1),begin,end,name);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
    SynNamespaceElement::SynNamespaceElement
              ((SynNamespaceElement *)CONCAT44(extraout_var_00,iVar2),local_78,
               (SynIdentifier *)CONCAT44(extraout_var,iVar1));
    local_48 = (SynNamespaceElement *)CONCAT44(extraout_var_00,iVar2);
    SmallArray<SynNamespaceElement_*,_32U>::push_back(this,&local_48);
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void ImportModuleNamespaces(ParseContext &ctx, Lexeme *pos, ByteCode *bCode)
{
	TRACE_SCOPE("parser", "ImportModuleNamespaces");

	char *symbols = FindSymbols(bCode);

	// Import namespaces
	ExternNamespaceInfo *namespaceList = FindFirstNamespace(bCode);

	for(unsigned i = 0; i < bCode->namespaceCount; i++)
	{
		ExternNamespaceInfo &ns = namespaceList[i];

		const char *name = symbols + ns.offsetToName;

		SynNamespaceElement *parent = NULL;

		if(ns.parentHash != ~0u)
		{
			for(unsigned k = 0; k < ctx.namespaceList.size(); k++)
			{
				if(ctx.namespaceList[k]->fullNameHash == ns.parentHash)
				{
					parent = ctx.namespaceList[k];
					break;
				}
			}

			if(!parent)
				Stop(ctx, pos, "ERROR: namespace %s parent not found", name);
		}

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), InplaceStr(name));

		ctx.namespaceList.push_back(new (ctx.get<SynNamespaceElement>()) SynNamespaceElement(parent, nameIdentifier));
	}
}